

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

void PARMCI_GroupFence(ARMCI_Group *group)

{
  int iVar1;
  comex_group_t group_00;
  
  group_00 = 0;
  if (0 < *group) {
    group_00 = *group;
  }
  iVar1 = comex_fence_all(group_00);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("COMEX_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x10e,"void PARMCI_GroupFence(ARMCI_Group *)");
}

Assistant:

void PARMCI_GroupFence(ARMCI_Group *group)
{
  int rc;
  if (*group > 0) {
    rc = comex_fence_all(*group);
  } else {
    rc = comex_fence_all(COMEX_GROUP_WORLD);
  }
  assert(COMEX_SUCCESS == rc);
}